

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O2

void __thiscall QGestureEvent::~QGestureEvent(QGestureEvent *this)

{
  *(undefined ***)this = &PTR__QGestureEvent_007c00c0;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->m_targetWidgets).d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->m_accepted).d);
  QArrayDataPointer<QGesture_*>::~QArrayDataPointer(&(this->m_gestures).d);
  QEvent::~QEvent(&this->super_QEvent);
  return;
}

Assistant:

QGestureEvent::~QGestureEvent()
{
}